

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  XmlWriter *this_00;
  int iVar1;
  long lVar2;
  char *pcVar3;
  XmlFormatting fmt;
  bool bVar4;
  StringRef name;
  StringRef name_00;
  StringRef ref;
  StringRef ref_00;
  ScopedElement SVar5;
  StringRef SVar6;
  StringRef attribute;
  ScopedElement e;
  long *local_68 [2];
  long local_58 [2];
  ScopedElement local_48;
  XmlWriter *local_38;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"OverallResult","");
  this_00 = &this->m_xml;
  fmt = (XmlFormatting)local_68;
  XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffc8,(string *)this_00,fmt);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  bVar4 = (testCaseStats->totals).assertions.failed == 0;
  pcVar3 = "false";
  if (bVar4) {
    pcVar3 = "true";
  }
  attribute.m_size = (ulong)bVar4 ^ 5;
  SVar6.m_size = 7;
  SVar6.m_start = "success";
  attribute.m_start = pcVar3;
  XmlWriter::writeAttribute(local_38,SVar6,attribute);
  name.m_size = 5;
  name.m_start = "skips";
  XmlWriter::writeAttribute<unsigned_long,void>
            (local_38,name,&(testCaseStats->totals).assertions.skipped);
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xb])();
  if (iVar1 == 1) {
    lVar2 = std::chrono::_V2::system_clock::now();
    local_68[0] = (long *)((double)((lVar2 - (this->m_testCaseTimer).m_nanoseconds) / 1000) /
                          1000000.0);
    name_00.m_size = 0x11;
    name_00.m_start = "durationInSeconds";
    XmlWriter::writeAttribute<double,void>(local_38,name_00,(double *)local_68);
  }
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"StdOut","");
    SVar5 = XmlWriter::scopedElement((XmlWriter *)&local_48,(string *)this_00,fmt);
    ref.m_size = SVar5._8_8_;
    ref.m_start = (char *)(testCaseStats->stdOut)._M_string_length;
    SVar6 = trim((Catch *)(testCaseStats->stdOut)._M_dataplus._M_p,ref);
    XmlWriter::writeText(local_48.m_writer,SVar6,Newline);
    XmlWriter::ScopedElement::~ScopedElement(&local_48);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"StdErr","");
    SVar5 = XmlWriter::scopedElement((XmlWriter *)&local_48,(string *)this_00,fmt);
    ref_00.m_size = SVar5._8_8_;
    ref_00.m_start = (char *)(testCaseStats->stdErr)._M_string_length;
    SVar6 = trim((Catch *)(testCaseStats->stdErr)._M_dataplus._M_p,ref_00);
    XmlWriter::writeText(local_48.m_writer,SVar6,Newline);
    XmlWriter::ScopedElement::~ScopedElement(&local_48);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success"_sr, testCaseStats.totals.assertions.allOk() );
        e.writeAttribute( "skips"_sr, testCaseStats.totals.assertions.skipped );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds"_sr, m_testCaseTimer.getElapsedSeconds() );
        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( StringRef(testCaseStats.stdOut) ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( StringRef(testCaseStats.stdErr) ), XmlFormatting::Newline );

        m_xml.endElement();
    }